

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O3

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  long lVar8;
  uint uVar9;
  pt_prj_t_conflict2 *ppVar10;
  uint64_t *puVar11;
  pt_aff_t_conflict2 *ppVar12;
  limb_t *plVar13;
  pt_prj_t_conflict2 *ppVar14;
  uint64_t *puVar15;
  limb_t *plVar16;
  byte bVar17;
  long lVar18;
  bool bVar19;
  byte bVar20;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  uchar b_n [64];
  pt_aff_t_conflict2 P;
  int8_t bnaf [513];
  int8_t anaf [513];
  pt_prj_t_conflict2 precomp [16];
  undefined1 local_15e8 [32];
  undefined1 local_15c8 [16];
  undefined1 local_15b8 [16];
  undefined1 local_15a8 [16];
  uint64_t local_1598;
  uint64_t uStack_1590;
  uint64_t local_1588;
  uint64_t uStack_1580;
  uint64_t local_1578;
  uint64_t uStack_1570;
  uint64_t local_1568;
  uint64_t uStack_1560;
  uint64_t local_1558;
  uint64_t uStack_1550;
  undefined1 local_1548 [16];
  undefined1 local_1538 [16];
  undefined1 local_1528 [16];
  undefined1 local_1518 [16];
  undefined1 local_1508 [16];
  uint8_t local_14f8 [64];
  uint8_t local_14b8 [64];
  uchar local_1478 [64];
  uchar local_1438 [64];
  pt_aff_t_conflict2 local_13f8;
  byte local_1358 [528];
  byte local_1148 [528];
  pt_prj_t_conflict2 local_f38 [16];
  
  bVar20 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar5 = 0;
  if (((((pBVar7 != (BIGNUM *)0x0) &&
        (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar6,pBVar7,ctx), iVar5 = iVar4,
        iVar3 != 0)) && (iVar4 = BN_bn2lebinpad(pBVar6,local_14b8,0x40), iVar4 == 0x40)) &&
      ((iVar4 = BN_bn2lebinpad(pBVar7,local_14f8,0x40), iVar4 == 0x40 &&
       (iVar4 = BN_bn2lebinpad(n,local_1438,0x40), iVar4 == 0x40)))) &&
     (iVar4 = BN_bn2lebinpad(m,local_1478,0x40), iVar4 == 0x40)) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_13f8.X,local_14b8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_13f8.Y,local_14f8);
    bVar17 = 0;
    memset(local_1148,0,0x201);
    memset(local_1358,0,0x201);
    memset((pt_prj_t_conflict2 *)local_15e8,0,0xf0);
    precomp_wnaf(local_f38,&local_13f8);
    scalar_wnaf((int8_t *)local_1148,local_1438);
    scalar_wnaf((int8_t *)local_1358,local_1478);
    bVar2 = true;
    lVar18 = 0x200;
    do {
      if (!bVar2) {
        point_double((pt_prj_t_conflict2 *)local_15e8,(pt_prj_t_conflict2 *)local_15e8);
      }
      bVar1 = local_1358[lVar18];
      if (bVar1 != 0) {
        if (bVar17 != bVar1 >> 7) {
          local_1598 = 0x1ffffffffffb8e - local_1598;
          uStack_1590 = 0xffffffffffffe - uStack_1590;
          local_1588 = 0xffffffffffffe - local_1588;
          uStack_1580 = 0xffffffffffffe - uStack_1580;
          local_1578 = 0xffffffffffffe - local_1578;
          uStack_1570 = 0x1ffffffffffffe - uStack_1570;
          local_1568 = 0xffffffffffffe - local_1568;
          uStack_1560 = 0xffffffffffffe - uStack_1560;
          local_1558 = 0xffffffffffffe - local_1558;
          uStack_1550 = 0xffffffffffffe - uStack_1550;
          bVar17 = bVar17 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar9 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          ppVar10 = local_f38 + (int)uVar9;
          ppVar14 = (pt_prj_t_conflict2 *)local_15e8;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            ppVar14->X[0] = ppVar10->X[0];
            ppVar10 = (pt_prj_t_conflict2 *)((long)ppVar10 + (ulong)bVar20 * -0x10 + 8);
            ppVar14 = (pt_prj_t_conflict2 *)((long)ppVar14 + (ulong)bVar20 * -0x10 + 8);
          }
          puVar11 = local_f38[(int)uVar9].Y;
          puVar15 = &local_1598;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
          }
          puVar11 = local_f38[(int)uVar9].Z;
          puVar15 = (uint64_t *)local_1548;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
          }
        }
        else {
          point_add_proj((pt_prj_t_conflict2 *)local_15e8,(pt_prj_t_conflict2 *)local_15e8,
                         local_f38 + (int)uVar9);
        }
        bVar2 = false;
      }
      bVar1 = local_1148[lVar18];
      if (bVar1 != 0) {
        if (bVar17 != bVar1 >> 7) {
          local_1598 = 0x1ffffffffffb8e - local_1598;
          uStack_1590 = 0xffffffffffffe - uStack_1590;
          local_1588 = 0xffffffffffffe - local_1588;
          uStack_1580 = 0xffffffffffffe - uStack_1580;
          local_1578 = 0xffffffffffffe - local_1578;
          uStack_1570 = 0x1ffffffffffffe - uStack_1570;
          local_1568 = 0xffffffffffffe - local_1568;
          uStack_1560 = 0xffffffffffffe - uStack_1560;
          local_1558 = 0xffffffffffffe - local_1558;
          uStack_1550 = 0xffffffffffffe - uStack_1550;
          bVar17 = bVar17 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar9 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          ppVar12 = lut_cmb[0] + (int)uVar9;
          ppVar10 = (pt_prj_t_conflict2 *)local_15e8;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            ppVar10->X[0] = ppVar12->X[0];
            ppVar12 = (pt_aff_t_conflict2 *)((long)ppVar12 + (ulong)bVar20 * -0x10 + 8);
            ppVar10 = (pt_prj_t_conflict2 *)((long)ppVar10 + (ulong)bVar20 * -0x10 + 8);
          }
          puVar11 = lut_cmb[0][(int)uVar9].Y;
          puVar15 = &local_1598;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
          }
          plVar13 = const_one;
          plVar16 = (limb_t *)local_1548;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *plVar16 = *plVar13;
            plVar13 = plVar13 + (ulong)bVar20 * -2 + 1;
            plVar16 = plVar16 + (ulong)bVar20 * -2 + 1;
          }
        }
        else {
          point_add_mixed((pt_prj_t_conflict2 *)local_15e8,(pt_prj_t_conflict2 *)local_15e8,
                          lut_cmb[0] + (int)uVar9);
        }
        bVar2 = false;
      }
      bVar19 = lVar18 != 0;
      lVar18 = lVar18 + -1;
    } while (bVar19);
    if (bVar2) {
      local_15a8 = (undefined1  [16])0x0;
      local_15b8 = (undefined1  [16])0x0;
      local_15c8 = (undefined1  [16])0x0;
      local_15e8._16_16_ = (undefined1  [16])0x0;
      local_15e8._0_16_ = (undefined1  [16])0x0;
      plVar13 = const_one;
      puVar11 = &local_1598;
      for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
        *puVar11 = *plVar13;
        plVar13 = plVar13 + (ulong)bVar20 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
      }
      local_1508 = (undefined1  [16])0x0;
      local_1518 = (undefined1  [16])0x0;
      local_1528 = (undefined1  [16])0x0;
      local_1538 = (undefined1  [16])0x0;
      local_1548 = (undefined1  [16])0x0;
    }
    if (bVar17 != 0) {
      local_1598 = 0x1ffffffffffb8e - local_1598;
      uStack_1590 = 0xffffffffffffe - uStack_1590;
      local_1588 = 0xffffffffffffe - local_1588;
      uStack_1580 = 0xffffffffffffe - uStack_1580;
      local_1578 = 0xffffffffffffe - local_1578;
      uStack_1570 = 0x1ffffffffffffe - uStack_1570;
      local_1568 = 0xffffffffffffe - local_1568;
      uStack_1560 = 0xffffffffffffe - uStack_1560;
      local_1558 = 0xffffffffffffe - local_1558;
      uStack_1550 = 0xffffffffffffe - uStack_1550;
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv((uint64_t *)local_1548,(uint64_t *)local_1548);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
              (local_13f8.X,(uint64_t *)local_15e8,(uint64_t *)local_1548);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul
              (local_13f8.Y,&local_1598,(uint64_t *)local_1548);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(local_14b8,local_13f8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(local_14f8,local_13f8.Y);
    iVar5 = CRYPTO_memcmp("",local_14b8,0x40);
    if ((iVar5 == 0) && (iVar5 = CRYPTO_memcmp("",local_14f8,0x40), iVar5 == 0)) {
      iVar5 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar5 == 0) {
        iVar5 = 0;
        goto LAB_00132e25;
      }
    }
    else {
      lVar18 = BN_lebin2bn(local_14b8,0x40,pBVar6);
      iVar5 = 0;
      if ((lVar18 == 0) ||
         ((lVar18 = BN_lebin2bn(local_14f8,0x40,pBVar7), lVar18 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar4 == 0))))
      goto LAB_00132e25;
    }
    iVar5 = 1;
  }
LAB_00132e25:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar5;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetA(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}